

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImRect ImGui::ShowMetricsWindow::Funcs::GetTableRect(ImGuiTable *table,int rect_type,int n)

{
  ImGuiTableColumn *pIVar1;
  ImGuiTableInstanceData *pIVar2;
  ImVec2 IVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ImRect IVar8;
  ImRect IVar9;
  ImRect IVar10;
  
  if ((long)table->InstanceCurrent == 0) {
    pIVar2 = &table->InstanceDataFirst;
  }
  else {
    pIVar2 = (table->InstanceDataExtra).Data + (long)table->InstanceCurrent + -1;
  }
  switch(rect_type) {
  case 0:
    return table->OuterRect;
  case 1:
    return table->InnerRect;
  case 2:
    return table->WorkRect;
  case 3:
    return table->HostClipRect;
  case 4:
    return table->InnerClipRect;
  case 5:
    return table->BgClipRect;
  case 6:
    pIVar1 = (table->Columns).Data;
    fVar6 = (table->InnerClipRect).Min.y;
    fVar7 = pIVar2->LastOuterHeight + fVar6;
    fVar5 = pIVar1[n].MinX;
    fVar4 = pIVar1[n].MaxX;
    break;
  case 7:
    pIVar1 = (table->Columns).Data;
    IVar3.y = (table->WorkRect).Min.y;
    IVar3.x = pIVar1[n].WorkMinX;
    fVar6 = pIVar1[n].WorkMaxX;
    fVar5 = (table->WorkRect).Max.y;
    goto LAB_001d326b;
  case 8:
    pIVar1 = (table->Columns).Data;
    IVar10.Max = pIVar1[n].ClipRect.Max;
    IVar10.Min = pIVar1[n].ClipRect.Min;
    return IVar10;
  case 9:
    pIVar1 = (table->Columns).Data;
    fVar6 = (table->InnerClipRect).Min.y;
    fVar7 = pIVar2->LastFirstRowHeight + fVar6;
    fVar5 = pIVar1[n].WorkMinX;
    fVar4 = pIVar1[n].ContentMaxXHeadersUsed;
    break;
  case 10:
    pIVar1 = (table->Columns).Data;
    fVar6 = (table->InnerClipRect).Min.y;
    fVar7 = pIVar2->LastFirstRowHeight + fVar6;
    fVar5 = pIVar1[n].WorkMinX;
    fVar4 = pIVar1[n].ContentMaxXHeadersIdeal;
    break;
  case 0xb:
    pIVar1 = (table->Columns).Data;
    fVar6 = (table->InnerClipRect).Min.y;
    fVar7 = pIVar2->LastFirstRowHeight + fVar6;
    fVar5 = pIVar1[n].WorkMinX;
    fVar4 = pIVar1[n].ContentMaxXFrozen;
    break;
  case 0xc:
    pIVar1 = (table->Columns).Data;
    IVar3.y = (table->InnerClipRect).Min.y + pIVar2->LastFirstRowHeight;
    IVar3.x = pIVar1[n].WorkMinX;
    fVar6 = pIVar1[n].ContentMaxXUnfrozen;
    fVar5 = (table->InnerClipRect).Max.y;
LAB_001d326b:
    IVar8.Max.y = fVar5;
    IVar8.Max.x = fVar6;
    IVar8.Min = IVar3;
    return IVar8;
  default:
    return (ImRect)ZEXT816(0);
  }
  IVar9.Max.y = fVar7;
  IVar9.Max.x = fVar4;
  IVar9.Min.y = fVar6;
  IVar9.Min.x = fVar5;
  return IVar9;
}

Assistant:

static ImRect GetTableRect(ImGuiTable* table, int rect_type, int n)
        {
            ImGuiTableInstanceData* table_instance = TableGetInstanceData(table, table->InstanceCurrent); // Always using last submitted instance
            if (rect_type == TRT_OuterRect)                     { return table->OuterRect; }
            else if (rect_type == TRT_InnerRect)                { return table->InnerRect; }
            else if (rect_type == TRT_WorkRect)                 { return table->WorkRect; }
            else if (rect_type == TRT_HostClipRect)             { return table->HostClipRect; }
            else if (rect_type == TRT_InnerClipRect)            { return table->InnerClipRect; }
            else if (rect_type == TRT_BackgroundClipRect)       { return table->BgClipRect; }
            else if (rect_type == TRT_ColumnsRect)              { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->MinX, table->InnerClipRect.Min.y, c->MaxX, table->InnerClipRect.Min.y + table_instance->LastOuterHeight); }
            else if (rect_type == TRT_ColumnsWorkRect)          { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->WorkRect.Min.y, c->WorkMaxX, table->WorkRect.Max.y); }
            else if (rect_type == TRT_ColumnsClipRect)          { ImGuiTableColumn* c = &table->Columns[n]; return c->ClipRect; }
            else if (rect_type == TRT_ColumnsContentHeadersUsed){ ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersUsed, table->InnerClipRect.Min.y + table_instance->LastFirstRowHeight); } // Note: y1/y2 not always accurate
            else if (rect_type == TRT_ColumnsContentHeadersIdeal){ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersIdeal, table->InnerClipRect.Min.y + table_instance->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentFrozen)     { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXFrozen, table->InnerClipRect.Min.y + table_instance->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentUnfrozen)   { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y + table_instance->LastFirstRowHeight, c->ContentMaxXUnfrozen, table->InnerClipRect.Max.y); }
            IM_ASSERT(0);
            return ImRect();
        }